

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.cpp
# Opt level: O2

bool __thiscall
phyr::Disk::intersectRay(Disk *this,Ray *r,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  Transform *this_00;
  double dVar1;
  double __x;
  double __y;
  double dVar2;
  double dVar3;
  Ray ray;
  Point3f local_4c8;
  Point2f local_4a8;
  Vector3f local_498;
  Vector3f local_478;
  Normal3f local_458;
  Normal3f local_438;
  Vector3f local_418;
  Vector3f local_3f8;
  Vector3f dErr;
  Vector3f oErr;
  SurfaceInteraction local_398;
  SurfaceInteraction local_1e0;
  
  oErr.z = 0.0;
  oErr.x = 0.0;
  oErr.y = 0.0;
  dErr.x = 0.0;
  dErr.y = 0.0;
  dErr.z = 0.0;
  Transform::operator()(&ray,(this->super_Shape).worldToLocal,r,&oErr,&dErr);
  if ((ray.d.z != 0.0) || (NAN(ray.d.z))) {
    dVar2 = (this->height - ray.o.z) / ray.d.z;
    if (dVar2 <= 0.0) {
      return false;
    }
    if (ray.tMax <= dVar2) {
      return false;
    }
    __x = dVar2 * ray.d.x + ray.o.x;
    __y = dVar2 * ray.d.y + ray.o.y;
    dVar3 = __x * __x + __y * __y;
    if ((dVar3 <= this->radius * this->radius) && (this->innerRadius * this->innerRadius <= dVar3))
    {
      local_4c8.x = __x;
      local_4c8.y = __y;
      dVar1 = atan2(__y,__x);
      local_4a8.x = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                            (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0));
      local_3f8.y = this->phiMax;
      if (local_4a8.x <= local_3f8.y) {
        local_4a8.x = local_4a8.x / local_3f8.y;
        dVar1 = this->innerRadius;
        local_418.y = 1.0 / SQRT(dVar3);
        local_4a8.y = 1.0 - (SQRT(dVar3) - dVar1) / (this->radius - dVar1);
        local_3f8.x = __y * -local_3f8.y;
        local_3f8.y = __x * local_3f8.y;
        local_3f8.z = 0.0;
        dVar1 = dVar1 - this->radius;
        local_418.z = dVar1 * 0.0 * local_418.y;
        local_418.x = local_418.y * dVar1 * __x;
        local_418.y = local_418.y * dVar1 * __y;
        local_438.x = 0.0;
        local_438.y = 0.0;
        local_438.z = 0.0;
        local_458.z = 0.0;
        local_458.x = 0.0;
        local_458.y = 0.0;
        local_4c8.z = this->height;
        local_478.z = 0.0;
        local_478.x = 0.0;
        local_478.y = 0.0;
        this_00 = (this->super_Shape).localToWorld;
        local_498.z = -ray.d.z;
        local_498.x = -ray.d.x;
        local_498.y = -ray.d.y;
        SurfaceInteraction::SurfaceInteraction
                  (&local_398,&local_4c8,&local_498,&local_478,&local_4a8,&local_3f8,&local_418,
                   &local_438,&local_458,&this->super_Shape);
        Transform::operator()(&local_1e0,this_00,&local_398);
        memcpy(si,&local_1e0,0x1b8);
        *t0 = dVar2;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Disk::intersectRay(const Ray& r, Real* t0, SurfaceInteraction* si,
                        bool testAlpha) const {
    // Transform {Ray} to local space
    Vector3f oErr, dErr;
    Ray ray = (*worldToLocal)(r, &oErr, &dErr);

    // Compute plane intersection for disk

    // Reject disk intersections for rays parallel to the disk's plane
    if (ray.d.z == 0) return false;
    Real tShapeHit = (height - ray.o.z) / ray.d.z;
    if (tShapeHit <= 0 || tShapeHit >= ray.tMax) return false;

    // See if hit point is inside disk radii and {phiMax}
    Point3f pHit = ray(tShapeHit);
    Real dist2 = pHit.x * pHit.x + pHit.y * pHit.y;
    if (dist2 > radius * radius || dist2 < innerRadius * innerRadius)
        return false;

    // Test disk {phi} value against {phiMax}
    Real phi = std::atan2(pHit.y, pHit.x);
    if (phi < 0) phi += 2 * Pi;
    if (phi > phiMax) return false;

    // Find parametric representation of disk hit
    Real u = phi / phiMax;
    Real rHit = std::sqrt(dist2);
    Real oneMinusV = ((rHit - innerRadius) / (radius - innerRadius));
    Real v = 1 - oneMinusV;
    Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
    Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
    Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

    // Refine disk intersection point
    pHit.z = height;

    // Compute error bounds for disk intersection
    Vector3f pError(0, 0, 0);

    // Initialize _SurfaceInteraction_ from parametric information
    *si = (*localToWorld)(SurfaceInteraction(pHit, -ray.d, pError, Point2f(u, v),
                                             dpdu, dpdv, dndu, dndv, this));

    // Update _tHit_ for quadric intersection
    *t0 = Real(tShapeHit);
    return true;
}